

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_setup_twice(APITests *this)

{
  undefined1 extraout_var;
  long in_RDI;
  int val;
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  undefined1 b;
  
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,1);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,1);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  GPIO::input(*(int *)(in_RDI + 0x24));
  b = extraout_var;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  assert::is_true((bool)b,in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_twice()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);

        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        auto val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::cleanup();
    }